

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::setText(QMessageBox *this,QString *text)

{
  QMessageBoxPrivate *this_00;
  QLabel *this_01;
  undefined1 on;
  TextFormat TVar1;
  QAnyStringView QVar2;
  
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QLabel::setText(this_00->label,text);
  this_01 = this_00->label;
  TVar1 = QLabel::textFormat(this_01);
  on = true;
  if (TVar1 != RichText) {
    TVar1 = QLabel::textFormat(this_00->label);
    if (TVar1 == AutoText) {
      QVar2.m_size = (text->d).size | 0x8000000000000000;
      QVar2.field_0.m_data_utf16 = (text->d).ptr;
      on = Qt::mightBeRichText(QVar2);
    }
    else {
      on = false;
    }
  }
  QLabel::setWordWrap(this_01,(bool)on);
  QMessageBoxPrivate::updateSize(this_00);
  return;
}

Assistant:

void QMessageBox::setText(const QString &text)
{
    Q_D(QMessageBox);
    d->label->setText(text);
    d->label->setWordWrap(d->label->textFormat() == Qt::RichText
        || (d->label->textFormat() == Qt::AutoText && Qt::mightBeRichText(text)));
    d->updateSize();
}